

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O1

FT_Error tt_size_reset(TT_Size size,FT_Bool only_height)

{
  ushort uVar1;
  FT_Face pFVar2;
  byte *pbVar3;
  FT_Fixed FVar4;
  FT_Fixed FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  FT_Pos FVar8;
  FT_UShort FVar9;
  undefined4 uVar10;
  void *pvVar11;
  FT_Error FVar12;
  long lVar13;
  FT_Long FVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  byte *pbVar19;
  ushort uVar20;
  
  pFVar2 = (size->root).face;
  FVar12 = 0;
  if (*(char *)&pFVar2[4].autohint.data == '\0') {
    (size->ttmetrics).valid = '\0';
    FVar9 = (size->root).metrics.y_ppem;
    uVar10 = *(undefined4 *)&(size->root).metrics.field_0x4;
    FVar4 = (size->root).metrics.x_scale;
    FVar5 = (size->root).metrics.y_scale;
    FVar6 = (size->root).metrics.ascender;
    FVar7 = (size->root).metrics.descender;
    FVar8 = (size->root).metrics.height;
    (size->hinted_metrics).x_ppem = (size->root).metrics.x_ppem;
    (size->hinted_metrics).y_ppem = FVar9;
    *(undefined4 *)&(size->hinted_metrics).field_0x4 = uVar10;
    (size->hinted_metrics).x_scale = FVar4;
    (size->hinted_metrics).y_scale = FVar5;
    (size->hinted_metrics).ascender = FVar6;
    (size->hinted_metrics).descender = FVar7;
    (size->hinted_metrics).height = FVar8;
    (size->hinted_metrics).max_advance = (size->root).metrics.max_advance;
    uVar1 = (size->hinted_metrics).x_ppem;
    FVar12 = 0x97;
    if ((uVar1 != 0) && ((size->hinted_metrics).y_ppem != 0)) {
      pvVar11 = pFVar2[1].generic.data;
      if (((ulong)pvVar11 & 8) != 0) {
        lVar13 = (long)(int)(size->hinted_metrics).y_scale;
        lVar16 = pFVar2->ascender * lVar13;
        (size->hinted_metrics).ascender =
             ((lVar16 >> 0x3f) + lVar16) * 0x10000 + 0x2080000000 >> 0x20 & 0xffffffffffffffc0;
        lVar16 = pFVar2->descender * lVar13;
        (size->hinted_metrics).descender =
             ((lVar16 >> 0x3f) + lVar16) * 0x10000 + 0x2080000000 >> 0x20 & 0xffffffffffffffc0;
        lVar13 = pFVar2->height * lVar13;
        (size->hinted_metrics).height =
             ((lVar13 >> 0x3f) + lVar13) * 0x10000 + 0x2080000000 >> 0x20 & 0xffffffffffffffc0;
      }
      (size->ttmetrics).valid = '\x01';
      FVar12 = 0;
      if (only_height == '\0') {
        if (((ulong)pvVar11 & 8) != 0) {
          FVar14 = FT_DivFix((ulong)uVar1 << 6,(ulong)pFVar2->units_per_EM);
          (size->hinted_metrics).x_scale = FVar14;
          FVar14 = FT_DivFix((ulong)(size->hinted_metrics).y_ppem << 6,(ulong)pFVar2->units_per_EM);
          (size->hinted_metrics).y_scale = FVar14;
          lVar13 = (long)(int)(size->hinted_metrics).x_scale * (long)pFVar2->max_advance_width;
          (size->hinted_metrics).max_advance =
               ((lVar13 >> 0x3f) + lVar13) * 0x10000 + 0x2080000000 >> 0x20 & 0xffffffffffffffc0;
        }
        uVar1 = (size->hinted_metrics).x_ppem;
        uVar20 = (size->hinted_metrics).y_ppem;
        if (uVar1 < uVar20) {
          (size->ttmetrics).scale = (size->hinted_metrics).y_scale;
          (size->ttmetrics).ppem = uVar20;
          FVar14 = FT_DivFix((ulong)uVar1,(ulong)uVar20);
          (size->ttmetrics).x_ratio = FVar14;
          FVar14 = 0x10000;
        }
        else {
          (size->ttmetrics).scale = (size->hinted_metrics).x_scale;
          (size->ttmetrics).ppem = uVar1;
          (size->ttmetrics).x_ratio = 0x10000;
          FVar14 = FT_DivFix((ulong)uVar20,(ulong)uVar1);
        }
        (size->ttmetrics).y_ratio = FVar14;
        uVar15 = pFVar2[5].num_fixed_sizes;
        pbVar19 = (byte *)0x0;
        if (uVar15 != 0) {
          uVar1 = (size->hinted_metrics).x_ppem;
          uVar18 = 0;
          do {
            uVar17 = uVar15 + uVar18 >> 1;
            pbVar3 = *(byte **)(*(long *)&pFVar2[5].num_charmaps + (ulong)uVar17 * 8);
            uVar20 = (ushort)*pbVar3;
            if (uVar20 <= uVar1) {
              if (uVar1 <= uVar20) {
                pbVar19 = pbVar3 + 2;
                break;
              }
              uVar18 = uVar17 + 1;
              uVar17 = uVar15;
            }
            uVar15 = uVar17;
          } while (uVar18 < uVar15);
        }
        size->widthp = pbVar19;
        size->metrics = &size->hinted_metrics;
        size->cvt_ready = -1;
        FVar12 = 0;
      }
    }
  }
  return FVar12;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_reset( TT_Size  size,
                 FT_Bool  only_height )
  {
    TT_Face           face;
    FT_Size_Metrics*  size_metrics;


    face = (TT_Face)size->root.face;

    /* nothing to do for CFF2 */
    if ( face->is_cff2 )
      return FT_Err_Ok;

    size->ttmetrics.valid = FALSE;

    size_metrics = &size->hinted_metrics;

    /* copy the result from base layer */
    *size_metrics = size->root.metrics;

    if ( size_metrics->x_ppem < 1 || size_metrics->y_ppem < 1 )
      return FT_THROW( Invalid_PPem );

    /* This bit flag, if set, indicates that the ppems must be       */
    /* rounded to integers.  Nearly all TrueType fonts have this bit */
    /* set, as hinting won't work really well otherwise.             */
    /*                                                               */
    if ( face->header.Flags & 8 )
    {
      /* the TT spec always asks for ROUND, not FLOOR or CEIL */
      size_metrics->ascender = FT_PIX_ROUND(
                                 FT_MulFix( face->root.ascender,
                                            size_metrics->y_scale ) );
      size_metrics->descender = FT_PIX_ROUND(
                                 FT_MulFix( face->root.descender,
                                            size_metrics->y_scale ) );
      size_metrics->height = FT_PIX_ROUND(
                               FT_MulFix( face->root.height,
                                          size_metrics->y_scale ) );
    }

    size->ttmetrics.valid = TRUE;

    if ( only_height )
    {
      /* we must not recompute the scaling values here since       */
      /* `tt_size_reset' was already called (with only_height = 0) */
      return FT_Err_Ok;
    }

    if ( face->header.Flags & 8 )
    {
      /* base scaling values on integer ppem values, */
      /* as mandated by the TrueType specification   */
      size_metrics->x_scale = FT_DivFix( size_metrics->x_ppem << 6,
                                         face->root.units_per_EM );
      size_metrics->y_scale = FT_DivFix( size_metrics->y_ppem << 6,
                                         face->root.units_per_EM );

      size_metrics->max_advance = FT_PIX_ROUND(
                                    FT_MulFix( face->root.max_advance_width,
                                               size_metrics->x_scale ) );
    }

    /* compute new transformation */
    if ( size_metrics->x_ppem >= size_metrics->y_ppem )
    {
      size->ttmetrics.scale   = size_metrics->x_scale;
      size->ttmetrics.ppem    = size_metrics->x_ppem;
      size->ttmetrics.x_ratio = 0x10000L;
      size->ttmetrics.y_ratio = FT_DivFix( size_metrics->y_ppem,
                                           size_metrics->x_ppem );
    }
    else
    {
      size->ttmetrics.scale   = size_metrics->y_scale;
      size->ttmetrics.ppem    = size_metrics->y_ppem;
      size->ttmetrics.x_ratio = FT_DivFix( size_metrics->x_ppem,
                                           size_metrics->y_ppem );
      size->ttmetrics.y_ratio = 0x10000L;
    }

    size->widthp = tt_face_get_device_metrics( face, size_metrics->x_ppem, 0 );

    size->metrics = size_metrics;

#ifdef TT_USE_BYTECODE_INTERPRETER
    size->cvt_ready = -1;
#endif /* TT_USE_BYTECODE_INTERPRETER */

    return FT_Err_Ok;
  }